

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O0

loop_info * __thiscall optimization::loop_expand::loop_info::operator++(loop_info *this,int param_2)

{
  ostream *poVar1;
  Timestamp *timestamp;
  ostream *poVar2;
  ostream *__a;
  Function *pFVar3;
  long in_RSI;
  loop_info *in_RDI;
  loop_info *res;
  loop_info *in_stack_fffffffffffffc28;
  Function *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc38;
  string *name;
  Function *in_stack_fffffffffffffc40;
  Function *this_00;
  Function *in_stack_fffffffffffffc58;
  ostream *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Timestamp *in_stack_fffffffffffffcb8;
  undefined1 local_309 [40];
  allocator<char> local_2e1;
  string local_2e0 [8];
  Severity *in_stack_fffffffffffffd28;
  ostream *in_stack_fffffffffffffd30;
  time_point_sys_clock local_268;
  Timestamp local_260;
  undefined1 local_248 [55];
  undefined1 local_211 [40];
  allocator<char> local_1e9;
  string local_1e8 [120];
  time_point_sys_clock local_170;
  Timestamp local_168 [3];
  undefined1 local_11a;
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [120];
  time_point_sys_clock local_78;
  Timestamp local_70 [3];
  undefined1 local_15;
  
  loop_info((loop_info *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  switch(*(undefined4 *)(in_RSI + 0x28)) {
  case 0:
    *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x2c) + *(int *)(in_RSI + 0x18);
    break;
  case 1:
    *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x18) - *(int *)(in_RSI + 0x2c);
    break;
  case 2:
    *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x2c) * *(int *)(in_RSI + 0x18);
    break;
  case 3:
    *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x18) / *(int *)(in_RSI + 0x2c);
    break;
  default:
    local_15 = 5;
    poVar1 = AixLog::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    AixLog::Tag::Tag((Tag *)0x1e7bc5);
    AixLog::operator<<(in_stack_fffffffffffffc60,(Tag *)in_stack_fffffffffffffc58);
    local_78.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_70,&local_78);
    timestamp = (Timestamp *)AixLog::operator<<(poVar1,in_stack_fffffffffffffcb8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
               (allocator<char> *)in_stack_fffffffffffffc60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
               (allocator<char> *)in_stack_fffffffffffffc60);
    AixLog::Function::Function
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (string *)in_stack_fffffffffffffc30,(size_t)in_stack_fffffffffffffc28);
    poVar2 = AixLog::operator<<(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    std::operator<<(poVar2,"ERROR ! Unrecognized change_op");
    AixLog::Function::~Function(in_stack_fffffffffffffc30);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    AixLog::Timestamp::~Timestamp(local_70);
    AixLog::Tag::~Tag((Tag *)0x1e7d3b);
    local_11a = 5;
    AixLog::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    AixLog::Tag::Tag((Tag *)0x1e7d6e);
    AixLog::operator<<(in_stack_fffffffffffffc60,(Tag *)in_stack_fffffffffffffc58);
    local_170.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_168,&local_170);
    AixLog::operator<<(poVar1,timestamp);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
               (allocator<char> *)in_stack_fffffffffffffc60);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,in_stack_fffffffffffffc68,(allocator<char> *)in_stack_fffffffffffffc60);
    AixLog::Function::Function
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (string *)in_stack_fffffffffffffc30,(size_t)in_stack_fffffffffffffc28);
    poVar2 = AixLog::operator<<(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    mir::inst::display_op
              ((ostream *)in_stack_fffffffffffffc30,(Op)((ulong)in_stack_fffffffffffffc28 >> 0x20));
    AixLog::Function::~Function(in_stack_fffffffffffffc30);
    std::__cxx11::string::~string((string *)(local_211 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_211);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    AixLog::Timestamp::~Timestamp(local_168);
    AixLog::Tag::~Tag((Tag *)0x1e7eca);
    local_248[0x36] = 5;
    AixLog::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    pFVar3 = (Function *)local_248;
    AixLog::Tag::Tag((Tag *)0x1e7efd);
    __a = AixLog::operator<<(in_stack_fffffffffffffc60,(Tag *)pFVar3);
    local_268.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(&local_260,&local_268);
    AixLog::operator<<(poVar1,timestamp);
    this_00 = (Function *)&local_2e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)poVar2,(allocator<char> *)__a);
    name = (string *)local_309;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)poVar2,(allocator<char> *)__a);
    AixLog::Function::Function
              (this_00,name,(string *)in_stack_fffffffffffffc30,(size_t)in_stack_fffffffffffffc28);
    pFVar3 = (Function *)AixLog::operator<<(__a,pFVar3);
    poVar1 = std::operator<<((ostream *)pFVar3," ! ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(pFVar3);
    std::__cxx11::string::~string((string *)(local_309 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_309);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    AixLog::Timestamp::~Timestamp(&local_260);
    AixLog::Tag::~Tag((Tag *)0x1e806b);
    break;
  case 5:
    *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x18) % *(int *)(in_RSI + 0x2c);
  }
  return in_RDI;
}

Assistant:

loop_info operator++(int) {
    loop_info res(*this);
    switch (change_op) {
      case mir::inst::Op::Add: {
        init_var.second += change_value;
        break;
      }
      case mir::inst::Op::Sub: {
        init_var.second -= change_value;
        break;
      }
      case mir::inst::Op::Mul: {
        init_var.second *= change_value;
        break;
      }
      case mir::inst::Op::Div: {
        init_var.second /= change_value;
        break;
      }
      case mir::inst::Op::Rem: {
        init_var.second %= change_value;
        break;
      }
      default: {
        LOG(ERROR) << "ERROR ! Unrecognized change_op";
        mir::inst::display_op(LOG(ERROR), change_op);
        LOG(ERROR) << " ! " << std::endl;
        break;
      }
    }
    return res;
  }